

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzwrite(gzFile file,void *buf,uint len)

{
  size_t sVar1;
  int in_EDX;
  size_t in_RSI;
  char *in_RDI;
  gz_state *state;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int32_t iVar2;
  
  if (in_RDI == (char *)0x0) {
    iVar2 = 0;
  }
  else if ((*(int *)(in_RDI + 0x18) == 0x79b1) && (*(int *)(in_RDI + 0x74) == 0)) {
    if (in_EDX < 0) {
      gz_error(state,in_stack_fffffffffffffffc,in_RDI);
      iVar2 = 0;
    }
    else {
      sVar1 = gz_write((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI);
      iVar2 = (int32_t)sVar1;
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Z_EXPORT PREFIX(gzwrite)(gzFile file, void const *buf, unsigned len) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* since an int is returned, make sure len fits in one, otherwise return
       with an error (this avoids a flaw in the interface) */
    if ((int)len < 0) {
        gz_error(state, Z_DATA_ERROR, "requested length does not fit in int");
        return 0;
    }

    /* write len bytes from buf (the return value will fit in an int) */
    return (int)gz_write(state, buf, len);
}